

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::~Shader(Shader *this)

{
  NonCopyable *in_RDI;
  TransientContextLock *unaff_retaddr;
  TransientContextLock lock;
  char *in_stack_00000130;
  uint in_stack_0000013c;
  char *in_stack_00000140;
  TransientContextLock *in_stack_fffffffffffffff0;
  
  GlResource::TransientContextLock::TransientContextLock(unaff_retaddr);
  if (*(int *)in_RDI != 0) {
    (*sf_ptrc_glDeleteObjectARB)(*(GLhandleARB *)in_RDI);
    priv::glCheckError(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  }
  GlResource::TransientContextLock::~TransientContextLock(in_stack_fffffffffffffff0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x15a314);
  std::
  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  ::~map((map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
          *)0x15a321);
  NonCopyable::~NonCopyable(in_RDI);
  GlResource::~GlResource((GlResource *)0x15a333);
  return;
}

Assistant:

Shader::~Shader()
{
    TransientContextLock lock;

    // Destroy effect program
    if (m_shaderProgram)
        glCheck(GLEXT_glDeleteObject(castToGlHandle(m_shaderProgram)));
}